

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# List.h
# Opt level: O3

bool __thiscall
JsUtil::ReadOnlyList<JITJavascriptString_*,_Memory::JitArenaAllocator,_DefaultComparer>::Contains
          (ReadOnlyList<JITJavascriptString_*,_Memory::JitArenaAllocator,_DefaultComparer> *this,
          JITJavascriptString **item)

{
  bool bVar1;
  long lVar2;
  
  if (this->count < 1) {
    return false;
  }
  lVar2 = 0;
  do {
    bVar1 = Js::JavascriptStringHelpers<JITJavascriptString>::Equals(*item,this->buffer[lVar2]);
    if (bVar1) {
      return bVar1;
    }
    lVar2 = lVar2 + 1;
  } while (lVar2 < this->count);
  return bVar1;
}

Assistant:

bool Contains(const T& item) const
        {
            for (int i = 0; i < count; i++)
            {
                if (TComparerType::Equals(item, buffer[i]))
                {
                    return true;
                }
            }
            return false;
        }